

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_InlineVariableSubstitution_Test::
~PrinterTest_InlineVariableSubstitution_Test(PrinterTest_InlineVariableSubstitution_Test *this)

{
  PrinterTest::~PrinterTest(&this->super_PrinterTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, InlineVariableSubstitution) {
  {
    Printer printer(output(), '$');
    printer.Print("Hello $foo$!\n", "foo", "World");
    printer.PrintRaw("RawBit\n");
    printer.Print("$foo$ $bar$\n", "foo", "one", "bar", "two");
    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "Hello World!\n"
            "RawBit\n"
            "one two\n");
}